

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O2

void __thiscall RealTrafficConnection::SetStatus(RealTrafficConnection *this,rtStatusTy s)

{
  string local_38;
  
  std::recursive_mutex::lock(&this->rtMutex);
  this->status = s;
  if ((int)dataRefs.iLogLevel < 2) {
    if (s == RT_STATUS_NONE) {
      local_38._M_dataplus._M_p = "Stopped";
    }
    else {
      GetStatusStr_abi_cxx11_(&local_38,this);
    }
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
           ,0x5af,"SetStatus",logINFO,"RealTraffic network status changed to: %s",
           local_38._M_dataplus._M_p);
    if (s != RT_STATUS_NONE) {
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->rtMutex);
  return;
}

Assistant:

void RealTrafficConnection::SetStatus(rtStatusTy s)
{
    // consistent status decision
    std::lock_guard<std::recursive_mutex> lock(rtMutex);

    status = s;
    LOG_MSG(logINFO, MSG_RT_STATUS,
            s == RT_STATUS_NONE ? "Stopped" : GetStatusStr().c_str());
}